

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_start_struct(flatcc_builder_t *B,size_t size,uint16_t align)

{
  int iVar1;
  uint16_t align_local;
  size_t size_local;
  flatcc_builder_t *B_local;
  
  iVar1 = enter_frame(B,align);
  if (iVar1 == 0) {
    B->frame->type = 2;
    refresh_ds(B,0xfffffffc);
    B_local = (flatcc_builder_t *)push_ds(B,(flatbuffers_uoffset_t)size);
  }
  else {
    B_local = (flatcc_builder_t *)0x0;
  }
  return B_local;
}

Assistant:

void *flatcc_builder_start_struct(flatcc_builder_t *B, size_t size, uint16_t align)
{
    /* Allocate space for the struct on the ds stack. */
    if (enter_frame(B, align)) {
        return 0;
    }
    frame(type) = flatcc_builder_struct;
    refresh_ds(B, data_limit);
    return push_ds(B, (uoffset_t)size);
}